

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.hpp
# Opt level: O1

bool __thiscall helics::NamedPoint::operator==(NamedPoint *this,NamedPoint *np)

{
  double dVar1;
  size_t __n;
  int iVar2;
  
  dVar1 = this->value;
  if ((((NAN(dVar1)) && (NAN(np->value))) ||
      ((dVar1 == np->value && (!NAN(dVar1) && !NAN(np->value))))) &&
     (__n = (this->name)._M_string_length, __n == (np->name)._M_string_length)) {
    if (__n != 0) {
      iVar2 = bcmp((this->name)._M_dataplus._M_p,(np->name)._M_dataplus._M_p,__n);
      return iVar2 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool operator==(const NamedPoint& np) const
    {
        return ((std::isnan(value)) && (std::isnan(np.value))) ?
            (name == np.name) :
            ((value == np.value) && (name == np.name));
    }